

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

DynamicState * __thiscall
vkt::Draw::PipelineCreateInfo::DynamicState::operator=(DynamicState *this,DynamicState *other)

{
  uint uVar1;
  VkDynamicState *__first;
  pointer pVVar2;
  pointer pVVar3;
  allocator_type local_29;
  pointer local_28;
  pointer pVStack_20;
  pointer local_18;
  
  (this->super_VkPipelineDynamicStateCreateInfo).sType =
       (other->super_VkPipelineDynamicStateCreateInfo).sType;
  (this->super_VkPipelineDynamicStateCreateInfo).pNext =
       (other->super_VkPipelineDynamicStateCreateInfo).pNext;
  (this->super_VkPipelineDynamicStateCreateInfo).flags =
       (other->super_VkPipelineDynamicStateCreateInfo).flags;
  uVar1 = (other->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount;
  (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount = uVar1;
  __first = (other->super_VkPipelineDynamicStateCreateInfo).pDynamicStates;
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)&local_28,__first,
             __first + uVar1,&local_29);
  pVVar2 = (this->m_dynamicStates).
           super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (this->m_dynamicStates).
           super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = local_28;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = pVStack_20;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_18;
  local_28 = (pointer)0x0;
  pVStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)pVVar3 - (long)pVVar2);
    if (local_28 != (pointer)0x0) {
      operator_delete(local_28,(long)local_18 - (long)local_28);
    }
  }
  (this->super_VkPipelineDynamicStateCreateInfo).pDynamicStates =
       (this->m_dynamicStates).
       super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  return this;
}

Assistant:

PipelineCreateInfo::DynamicState& PipelineCreateInfo::DynamicState::operator= (const DynamicState& other)
{
	sType = other.sType;
	pNext = other.pNext;

	flags				= other.flags;
	dynamicStateCount	= other.dynamicStateCount;
	m_dynamicStates		= std::vector<vk::VkDynamicState>(other.pDynamicStates, other.pDynamicStates + dynamicStateCount);
	pDynamicStates		= &m_dynamicStates[0];

	return *this;
}